

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subbreak2.cpp
# Opt level: O1

bool Cipher::subbreak1(TParameters *params,TFreqMap *freqMap,TResult *result)

{
  TClusters *clusters;
  TProb TVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  pointer piVar5;
  mapped_type_conflict *pmVar6;
  int i;
  int iVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  float letterFreqCost;
  int nLetters;
  float local_1a8;
  int local_1a4;
  TFreqMap *local_1a0;
  TProb local_198;
  int local_190;
  int local_18c;
  TClusterCount clusterCount;
  TLetterCount letterCount;
  TClusterPos clusterPos;
  TPlainText plainText;
  TClusterToLetterMap cura;
  TClusterToLetterMap itera;
  TClusterToLetterMap besta;
  map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_> fixed;
  
  plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  clusterPos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  clusterPos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  clusterPos.
  super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  nLetters = 0;
  letterFreqCost = 0.0;
  local_1a0 = freqMap;
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::_Rb_tree(&besta._M_t,&(result->clMap)._M_t);
  clusters = &result->clusters;
  getRandomCLMap(params,clusters,&besta);
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &fixed._M_t._M_impl.super__Rb_tree_header._M_header;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  fixed._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  piVar5 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       fixed._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < (int)((ulong)((long)(params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar5) >> 2)) {
    lVar10 = 0;
    lVar9 = 0;
    do {
      if (-1 < *(int *)((long)piVar5 + lVar10)) {
        pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[](&fixed,(key_type_conflict *)
                                   ((long)(clusters->super__Vector_base<int,_std::allocator<int>_>).
                                          _M_impl.super__Vector_impl_data._M_start + lVar10));
        *pmVar6 = true;
      }
      lVar9 = lVar9 + 1;
      piVar5 = (params->hint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar10 = lVar10 + 4;
    } while (lVar9 < (int)((ulong)((long)(params->hint).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish - (long)piVar5) >> 2));
  }
  anon_unknown.dwarf_55bba::calcHelpers
            (params,&besta,clusters,&plainText,&letterCount,&clusterCount,&clusterPos,&nLetters,
             &letterFreqCost);
  iVar4 = params->nSubbreakIterations;
  if (iVar4 != 0) {
    TVar1 = calcScore1(params,local_1a0,&plainText,letterFreqCost);
    local_1a8 = (float)TVar1;
    iVar8 = 0;
    do {
      if (iVar8 < 100) {
        local_18c = iVar8 + 1;
      }
      else {
        getRandomCLMap(params,clusters,(TClusterToLetterMap *)&besta._M_t);
        anon_unknown.dwarf_55bba::calcHelpers
                  (params,(TClusterToLetterMap *)&besta._M_t,clusters,&plainText,&letterCount,
                   &clusterCount,&clusterPos,&nLetters,&letterFreqCost);
        TVar1 = calcScore1(params,local_1a0,&plainText,letterFreqCost);
        local_1a8 = (float)TVar1;
        local_18c = 0;
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&itera._M_t,&besta._M_t);
      iVar8 = nLetters;
      iVar7 = 0;
      do {
        do {
          iVar3 = rand();
          cura._M_t._M_impl._0_4_ = iVar3 % params->maxClusters;
          local_1a4 = rand();
          local_1a4 = local_1a4 % params->maxClusters;
        } while (cura._M_t._M_impl._0_4_ == local_1a4);
        pmVar6 = std::map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                 operator[](&fixed,(key_type_conflict *)&cura);
        if ((*pmVar6 == false) &&
           (pmVar6 = std::
                     map<int,_bool,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>::
                     operator[](&fixed,&local_1a4), *pmVar6 == false)) {
          anon_unknown.dwarf_55bba::updateHelpers
                    (params,&clusterCount,&clusterPos,iVar8,cura._M_t._M_impl._0_4_,local_1a4,&itera
                     ,&plainText,&letterCount,&letterFreqCost);
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 != 3);
      local_190 = iVar4 + -1;
      local_198 = calcScore1(params,local_1a0,&plainText,letterFreqCost);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::_Rb_tree(&cura._M_t,&itera._M_t);
      iVar7 = nLetters;
      iVar8 = 0;
      do {
        do {
          iVar4 = rand();
          iVar4 = iVar4 % params->maxClusters;
          iVar3 = rand();
          iVar3 = iVar3 % params->maxClusters;
        } while (iVar4 == iVar3);
        anon_unknown.dwarf_55bba::updateHelpers
                  (params,&clusterCount,&clusterPos,iVar7,iVar4,iVar3,&cura,&plainText,&letterCount,
                   &letterFreqCost);
        TVar1 = calcScore1(params,local_1a0,&plainText,letterFreqCost);
        if (TVar1 <= local_198) {
          anon_unknown.dwarf_55bba::updateHelpers
                    (params,&clusterCount,&clusterPos,iVar7,iVar4,iVar3,&cura,&plainText,
                     &letterCount,&letterFreqCost);
          iVar3 = iVar8;
        }
        else {
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::operator=(&itera._M_t,&cura._M_t);
          iVar3 = 0;
          local_198 = TVar1;
        }
        iVar4 = local_190;
        iVar8 = iVar3 + 1;
      } while (iVar3 < 9);
      iVar8 = local_18c;
      if ((double)local_1a8 < local_198) {
        std::
        _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        ::operator=(&besta._M_t,&itera._M_t);
        local_1a8 = (float)local_198;
        dVar2 = (double)local_1a8;
        iVar8 = 0;
        if (result->p <= dVar2 && dVar2 != result->p) {
          result->p = dVar2;
          std::
          _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
          ::operator=(&(result->clMap)._M_t,&besta._M_t);
        }
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&cura._M_t);
      std::
      _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
      ::~_Rb_tree(&itera._M_t);
    } while (iVar4 != 0);
  }
  std::
  _Rb_tree<int,_std::pair<const_int,_bool>,_std::_Select1st<std::pair<const_int,_bool>_>,_std::less<int>,_std::allocator<std::pair<const_int,_bool>_>_>
  ::~_Rb_tree(&fixed._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree(&besta._M_t);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&clusterPos);
  if (clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)clusterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)letterCount.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)plainText.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return true;
}

Assistant:

bool subbreak1(
        const TParameters & params,
        const TFreqMap & freqMap,
        TResult & result) {

        // helpers
        TPlainText plainText;
        TLetterCount letterCount;
        TClusterCount clusterCount;
        TClusterPos clusterPos;

        int nLetters = 0;
        float letterFreqCost = 0.0f;

        const auto & clusters = result.clusters;
        auto & clMap = result.clMap;
        auto & minBestP = result.p;

        auto besta = clMap;
        getRandomCLMap(params, clusters, besta);

        std::map<TLetter, bool> fixed;
        for (int i = 0; i < (int) params.hint.size(); ++i) {
            if (params.hint[i] < 0) continue;
            fixed[clusters[i]] = true;
        }

        ::calcHelpers(params, besta, clusters, plainText, letterCount, clusterCount, clusterPos, nLetters, letterFreqCost);
        float bestp = calcScore1(params, freqMap, plainText, letterFreqCost);

        int nIters = 0;
        int nMainIters = params.nSubbreakIterations;
        while (nMainIters--) {
            if (++nIters > 100) {
                getRandomCLMap(params, clusters, besta);

                ::calcHelpers(params, besta, clusters, plainText, letterCount, clusterCount, clusterPos, nLetters, letterFreqCost);
                bestp = calcScore1(params, freqMap, plainText, letterFreqCost);

                nIters = 0;
            }

            auto itera = besta;

            int nswaps = 3;
            for (int i = 0; i < nswaps; ++i) {
                int a0 = rand()%params.maxClusters;
                int a1 = rand()%params.maxClusters;
                while (a0 == a1) {
                    a0 = rand()%params.maxClusters;
                    a1 = rand()%params.maxClusters;
                }

                if (fixed[a0] || fixed[a1]) {
                } else {
                    //std::swap(itera[a0], itera[a1]);
                    ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, itera, plainText, letterCount, letterFreqCost);
                }
            }

            auto iterp = calcScore1(params, freqMap, plainText, letterFreqCost);

            auto cura = itera;
            for (int i = 0; i < 10; ++i) {
                int a0 = rand()%params.maxClusters;
                int a1 = rand()%params.maxClusters;
                while (a0 == a1) {
                    a0 = rand()%params.maxClusters;
                    a1 = rand()%params.maxClusters;
                }

                //std::swap(cura[a0], cura[a1]);
                ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, cura, plainText, letterCount, letterFreqCost);
                auto curp = calcScore1(params, freqMap, plainText, letterFreqCost);

                if (curp > iterp) {
                    iterp = curp;
                    itera = cura;
                    i = 0;
                } else {
					//std::swap(cura[a0], cura[a1]);
                    ::updateHelpers(params, clusterCount, clusterPos, nLetters, a0, a1, cura, plainText, letterCount, letterFreqCost);
                }
            }

            if (iterp > bestp) {
                besta = itera;
                bestp = iterp;

                if (bestp > minBestP) {
                    minBestP = bestp;
                    clMap = besta;
                }
                nIters = 0;
            }
        }

        return true;
    }